

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcc_functional_test.cc
# Opt level: O2

void in_memory_snapshot_rollback_test(void)

{
  fdb_kvs_handle *handle;
  fdb_status fVar1;
  size_t keylen;
  uint uVar2;
  long lVar3;
  char *__format;
  fdb_kvs_handle *kvs;
  fdb_file_handle *file;
  fdb_iterator *iterator;
  fdb_doc *rdoc;
  fdb_kvs_handle *snap_db;
  char str [15];
  timeval __test_begin;
  fdb_kvs_info kvs_info;
  fdb_kvs_config local_140;
  fdb_config local_128;
  
  gettimeofday((timeval *)&__test_begin,(__timezone_ptr_t)0x0);
  memleak_start();
  system("rm -rf  mvcc_test* > errorlog.txt");
  fdb_get_default_config();
  fVar1 = fdb_open(&file,"mvcc_test1",&local_128);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x137c);
    in_memory_snapshot_rollback_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x137c,"void in_memory_snapshot_rollback_test()");
  }
  fdb_get_default_kvs_config();
  fVar1 = fdb_kvs_open_default(file,&kvs,&local_140);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x137f);
    in_memory_snapshot_rollback_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x137f,"void in_memory_snapshot_rollback_test()");
  }
  uVar2 = 1;
  while (uVar2 != 4) {
    sprintf(str,"%d",(ulong)uVar2);
    handle = kvs;
    keylen = strlen(str);
    fVar1 = fdb_set_kv(handle,str,keylen,"value",5);
    uVar2 = uVar2 + 1;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0x1385);
      in_memory_snapshot_rollback_test()::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x1385,"void in_memory_snapshot_rollback_test()");
    }
  }
  fdb_commit(file,'\0');
  fVar1 = fdb_set_kv(kvs,"key4",4,"value",5);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x138c);
    in_memory_snapshot_rollback_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x138c,"void in_memory_snapshot_rollback_test()");
  }
  fVar1 = fdb_set_kv(kvs,"key5",4,"value",5);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x138e);
    in_memory_snapshot_rollback_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x138e,"void in_memory_snapshot_rollback_test()");
  }
  fVar1 = fdb_commit(file,'\x01');
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x1390);
    in_memory_snapshot_rollback_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x1390,"void in_memory_snapshot_rollback_test()");
  }
  lVar3 = 3;
  fVar1 = fdb_rollback(&kvs,3);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x1394);
    in_memory_snapshot_rollback_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x1394,"void in_memory_snapshot_rollback_test()");
  }
  fdb_get_kvs_info(kvs,&kvs_info);
  if (kvs_info.last_seqnum != 3) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
           );
    in_memory_snapshot_rollback_test()::__test_pass = '\x01';
    if (kvs_info.last_seqnum != 3) {
      __assert_fail("kvs_info.last_seqnum == rollback_to",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x1396,"void in_memory_snapshot_rollback_test()");
    }
  }
  fVar1 = fdb_snapshot_open(kvs,&snap_db,0xffffffffffffffff);
  if (fVar1 == FDB_RESULT_SUCCESS) {
    fdb_iterator_init(snap_db,&iterator,(void *)0x0,0,(void *)0x0,0,0);
    rdoc = (fdb_doc *)0x0;
    do {
      fVar1 = fdb_iterator_get(iterator,&rdoc);
      if (fVar1 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x13a1);
        in_memory_snapshot_rollback_test()::__test_pass = 1;
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0x13a1,"void in_memory_snapshot_rollback_test()");
      }
      fdb_doc_free(rdoc);
      rdoc = (fdb_doc *)0x0;
      fVar1 = fdb_iterator_next(iterator);
      lVar3 = lVar3 + -1;
    } while (fVar1 != FDB_RESULT_ITERATOR_FAIL);
    if (lVar3 == 0) {
      fdb_iterator_close(iterator);
      fdb_kvs_close(snap_db);
      fdb_close(file);
      fdb_shutdown();
      memleak_end();
      __format = "%s PASSED\n";
      if (in_memory_snapshot_rollback_test()::__test_pass != '\0') {
        __format = "%s FAILED\n";
      }
      fprintf(_stderr,__format,"in-memory snapshot rollback test");
      return;
    }
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x13a6);
    in_memory_snapshot_rollback_test()::__test_pass = 1;
    __assert_fail("c==rollback_to",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x13a6,"void in_memory_snapshot_rollback_test()");
  }
  fprintf(_stderr,"Test failed: %s %d\n",
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
          ,0x139a);
  in_memory_snapshot_rollback_test()::__test_pass = 1;
  __assert_fail("status == FDB_RESULT_SUCCESS",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x139a,"void in_memory_snapshot_rollback_test()");
}

Assistant:

void in_memory_snapshot_rollback_test()
{

    TEST_INIT();
    memleak_start();

    int i, r;
    char str[15];
    fdb_file_handle *file;
    fdb_kvs_handle *kvs, *snap_db;
    fdb_iterator *iterator;
    fdb_status status;
    fdb_config config;
    fdb_doc *rdoc;
    fdb_kvs_config kvs_config;
    fdb_kvs_info kvs_info;
    fdb_seqnum_t c, rollback_to = 3;

    r = system(SHELL_DEL" mvcc_test* > errorlog.txt");
    (void)r;

    config = fdb_get_default_config();
    status = fdb_open(&file, "mvcc_test1", &config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    kvs_config = fdb_get_default_kvs_config();
    status = fdb_kvs_open_default(file, &kvs, &kvs_config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // set 3 keys commits
    for(i=1;i<=3;i++) {
        sprintf(str, "%d", i);
        status = fdb_set_kv(kvs, str, strlen(str), (void*)"value", 5);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }
    // commit  normal
    fdb_commit(file, FDB_COMMIT_NORMAL);

    // set 2 more and commit w/flush
    status = fdb_set_kv(kvs, (void *)"key4", 4, (void*)"value", 5);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_set_kv(kvs, (void *)"key5", 4, (void*)"value", 5);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_commit(file, FDB_COMMIT_MANUAL_WAL_FLUSH);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // rollback to 3
    status = fdb_rollback(&kvs, rollback_to);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    fdb_get_kvs_info(kvs, &kvs_info);
    TEST_CHK(kvs_info.last_seqnum == rollback_to);

    // take a in-mem snapshot and iterate over kvs
    status = fdb_snapshot_open(kvs, &snap_db, FDB_SNAPSHOT_INMEM);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    fdb_iterator_init(snap_db, &iterator, NULL, 0, NULL, 0, FDB_ITR_NONE);
    rdoc = NULL;
    c = 0;
    do {
        status = fdb_iterator_get(iterator, &rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        fdb_doc_free(rdoc);
        rdoc = NULL;
        c++;
    } while (fdb_iterator_next(iterator) != FDB_RESULT_ITERATOR_FAIL);
    TEST_CHK(c==rollback_to);

    fdb_iterator_close(iterator);
    fdb_kvs_close(snap_db);
    fdb_close(file);
    fdb_shutdown();

    memleak_end();
    TEST_RESULT("in-memory snapshot rollback test");
}